

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O0

void option_side_effects(Telnet *telnet,Opt *o,_Bool enabled)

{
  _Bool enabled_local;
  Opt *o_local;
  Telnet *telnet_local;
  
  if ((o->option == 1) && (o->send == 0xfd)) {
    telnet->echoing = (_Bool)((enabled ^ 0xffU) & 1);
  }
  else if ((o->option == 3) && (o->send == 0xfd)) {
    telnet->editing = (_Bool)((enabled ^ 0xffU) & 1);
  }
  if (telnet->ldisc != (Ldisc *)0x0) {
    ldisc_echoedit_update(telnet->ldisc);
  }
  if ((telnet->activated & 1U) == 0) {
    if (telnet->opt_states[5] == 2) {
      telnet->opt_states[5] = 0;
      send_opt(telnet,0xfd,1);
    }
    if (telnet->opt_states[6] == 2) {
      telnet->opt_states[6] = 0;
      send_opt(telnet,0xfb,3);
    }
    if (telnet->opt_states[7] == 2) {
      telnet->opt_states[7] = 0;
      send_opt(telnet,0xfd,3);
    }
    telnet->activated = true;
  }
  return;
}

Assistant:

static void option_side_effects(
    Telnet *telnet, const struct Opt *o, bool enabled)
{
    if (o->option == TELOPT_ECHO && o->send == DO)
        telnet->echoing = !enabled;
    else if (o->option == TELOPT_SGA && o->send == DO)
        telnet->editing = !enabled;
    if (telnet->ldisc)                 /* cause ldisc to notice the change */
        ldisc_echoedit_update(telnet->ldisc);

    /* Ensure we get the minimum options */
    if (!telnet->activated) {
        if (telnet->opt_states[o_echo.index] == INACTIVE) {
            telnet->opt_states[o_echo.index] = REQUESTED;
            send_opt(telnet, o_echo.send, o_echo.option);
        }
        if (telnet->opt_states[o_we_sga.index] == INACTIVE) {
            telnet->opt_states[o_we_sga.index] = REQUESTED;
            send_opt(telnet, o_we_sga.send, o_we_sga.option);
        }
        if (telnet->opt_states[o_they_sga.index] == INACTIVE) {
            telnet->opt_states[o_they_sga.index] = REQUESTED;
            send_opt(telnet, o_they_sga.send, o_they_sga.option);
        }
        telnet->activated = true;
    }
}